

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O1

void __thiscall
compressed_distance_matrix<(compressed_matrix_layout)0>::
compressed_distance_matrix<compressed_distance_matrix<(compressed_matrix_layout)1>>
          (compressed_distance_matrix<(compressed_matrix_layout)0> *this,
          compressed_distance_matrix<(compressed_matrix_layout)1> *mat)

{
  pointer ppfVar1;
  long lVar2;
  pointer ppfVar3;
  float *pfVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  size_t j;
  ulong uVar9;
  int iVar10;
  float fVar11;
  allocator_type local_12;
  allocator_type local_11;
  
  lVar2 = (long)(mat->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(mat->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  std::vector<float,_std::allocator<float>_>::vector
            (&this->distances,(ulong)((lVar2 + -1) * lVar2) >> 1,&local_11);
  std::vector<float_*,_std::allocator<float_*>_>::vector
            (&this->rows,
             (long)(mat->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(mat->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_12);
  ppfVar3 = (this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppfVar3)) {
    pfVar4 = (this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 1;
    do {
      ppfVar3[uVar6] = pfVar4;
      pfVar4 = pfVar4 + uVar6;
      uVar6 = uVar6 + 1;
      ppfVar3 = (this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->rows).
                                   super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppfVar3 >> 3));
  }
  ppfVar3 = (this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = (long)(this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppfVar3 >> 3;
  if (1 < uVar6) {
    uVar7 = 1;
    do {
      ppfVar1 = (mat->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar4 = ppfVar3[uVar7];
      uVar9 = 0;
      do {
        fVar11 = 0.0;
        iVar5 = (int)uVar7;
        iVar8 = (int)uVar9;
        if (iVar5 != iVar8) {
          iVar10 = iVar8;
          if (iVar8 < iVar5) {
            iVar10 = iVar5;
          }
          if (iVar5 < iVar8) {
            iVar8 = iVar5;
          }
          fVar11 = ppfVar1[iVar8][iVar10];
        }
        pfVar4[uVar9] = fVar11;
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar6);
  }
  return;
}

Assistant:

compressed_distance_matrix(const DistanceMatrix& mat)
	    : distances(mat.size() * (mat.size() - 1) / 2), rows(mat.size()) {
		init_rows();

		for (size_t i = 1ul; i < size(); ++i)
			for (size_t j = 0ul; j < i; ++j) rows[i][j] = mat(index_t(i), index_t(j));
	}